

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O1

bool __thiscall
wasm::DAE::removeReturnValue
          (DAE *this,Function *func,vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls,
          Module *module)

{
  HeapType *this_00;
  pointer ppCVar1;
  Call *left;
  ulong uVar2;
  __node_base_ptr p_Var3;
  bool bVar4;
  MixedArena *this_01;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  Expression *right;
  Block *pBVar7;
  ulong uVar8;
  pointer ppCVar9;
  __node_base_ptr p_Var10;
  Signature SVar11;
  Signature sig;
  optional<wasm::Type> type;
  Type local_48;
  Builder builder;
  
  this_00 = &func->type;
  builder.wasm = module;
  SVar11 = HeapType::getSignature(this_00);
  local_48 = SVar11.results.id;
  bVar4 = wasm::Type::isNull(&local_48);
  if (bVar4) {
    SVar11 = HeapType::getSignature(this_00);
    bVar4 = ((undefined1  [16])SVar11 & (undefined1  [16])0x3) == (undefined1  [16])0x0 &&
            6 < SVar11.results.id.id;
  }
  else {
    bVar4 = false;
  }
  SVar11 = HeapType::getSignature(this_00);
  sig.results.id = 0;
  sig.params.id = SVar11.params.id.id;
  HeapType::HeapType((HeapType *)&local_48,sig);
  this_00->id = local_48.id;
  ppCVar9 = (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar1 = (calls->super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar9 != ppCVar1) {
    this_01 = &(builder.wasm)->allocator;
    do {
      left = *ppCVar9;
      uVar2 = (this->allDroppedCalls)._M_h._M_bucket_count;
      uVar8 = (ulong)left % uVar2;
      p_Var3 = (this->allDroppedCalls)._M_h._M_buckets[uVar8];
      p_Var5 = (__node_base_ptr)0x0;
      if ((p_Var3 != (__node_base_ptr)0x0) &&
         (p_Var5 = p_Var3, p_Var10 = p_Var3->_M_nxt, left != (Call *)p_Var3->_M_nxt[1]._M_nxt)) {
        while (p_Var6 = p_Var10->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
          p_Var5 = (__node_base_ptr)0x0;
          if (((ulong)p_Var6[1]._M_nxt % uVar2 != uVar8) ||
             (p_Var5 = p_Var10, p_Var10 = p_Var6, left == (Call *)p_Var6[1]._M_nxt))
          goto LAB_00839d64;
        }
        p_Var5 = (__node_base_ptr)0x0;
      }
LAB_00839d64:
      if (p_Var5 == (__node_base_ptr)0x0) {
        p_Var6 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var6 = p_Var5->_M_nxt;
      }
      if (p_Var6 == (_Hash_node_base *)0x0) {
        __assert_fail("iter != allDroppedCalls.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DeadArgumentElimination.cpp"
                      ,0x1b8,
                      "bool wasm::DAE::removeReturnValue(Function *, std::vector<Call *> &, Module *)"
                     );
      }
      p_Var6 = p_Var6[2]._M_nxt;
      if (bVar4 == false) {
        p_Var6->_M_nxt = (_Hash_node_base *)left;
      }
      else {
        local_48.id = (uintptr_t)builder.wasm;
        right = (Expression *)MixedArena::allocSpace(this_01,0x10,8);
        right->_id = UnreachableId;
        (right->type).id = 1;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar8;
        pBVar7 = Builder::makeSequence((Builder *)&local_48,(Expression *)left,right,type);
        p_Var6->_M_nxt = (_Hash_node_base *)pBVar7;
      }
      if ((left->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id != 1) {
        (left->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id = 0;
      }
      ppCVar9 = ppCVar9 + 1;
    } while (ppCVar9 != ppCVar1);
  }
  ReturnUtils::removeReturns(func,builder.wasm);
  return bVar4;
}

Assistant:

bool
  removeReturnValue(Function* func, std::vector<Call*>& calls, Module* module) {
    // If the result type is uninhabitable, then the caller knows the call will
    // never return. That useful information would be lost if we did nothing
    // else when removing the return value, but we will insert an `unreachable`
    // after the call in the caller to preserve the optimization effect. TODO:
    // Do this for more complicated uninhabitable types such as non-nullable
    // references to structs with non-nullable reference cycles.
    bool wasReturnUninhabitable =
      func->getResults().isNull() && func->getResults().isNonNullable();
    func->setResults(Type::none);
    // Remove the drops on the calls. Note that we must do this before updating
    // returns in ReturnUpdater, as there may be recursive calls of this
    // function to itself. So we first use the information in allDroppedCalls
    // before the ReturnUpdater potentially invalidates that information as it
    // modifies the function.
    for (auto* call : calls) {
      auto iter = allDroppedCalls.find(call);
      assert(iter != allDroppedCalls.end());
      Expression** location = iter->second;
      if (wasReturnUninhabitable) {
        Builder builder(*module);
        *location = builder.makeSequence(call, builder.makeUnreachable());
      } else {
        *location = call;
      }
      // Update the call's type.
      if (call->type != Type::unreachable) {
        call->type = Type::none;
      }
    }
    // Remove any return values.
    ReturnUtils::removeReturns(func, *module);
    // It's definitely worth optimizing the caller after inserting the
    // unreachable.
    return wasReturnUninhabitable;
  }